

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
WSNTopologyBasedEnergy::SelectServalNode
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,WSNTopologyBasedEnergy *this)

{
  Scalar *pSVar1;
  double *pdVar2;
  WSNNode *pWVar3;
  iterator __position;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  WSNTopologyBasedEnergy *pWVar8;
  int *piVar9;
  WSNTopologyBasedEnergy *local_128 [2];
  undefined1 local_118 [32];
  WSNTopologyBasedEnergy *local_f8;
  undefined8 local_f0;
  Scalar local_e8;
  WSNNode local_c8;
  double local_88;
  double dStack_80;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = time((time_t *)0x0);
  pWVar8 = (WSNTopologyBasedEnergy *)(uVar7 & 0xffffffff);
  srand((uint)uVar7);
  iVar4 = rand();
  if (-1 < iVar4 % 9) {
    iVar4 = iVar4 % 9 + 1;
    do {
      iVar5 = rand();
      local_128[0] = (WSNTopologyBasedEnergy *)CONCAT44(local_128[0]._4_4_,iVar5 % 99);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        pWVar8 = (WSNTopologyBasedEnergy *)__return_storage_ptr__;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,__position,(int *)local_128);
      }
      else {
        *__position._M_current = iVar5 % 99;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  local_118._16_8_ = 0;
  do {
    for (piVar9 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar9 != (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish; piVar9 = piVar9 + 1) {
      iVar4 = *piVar9;
      local_78 = *(double *)&this->node[iVar4].leaderID;
      local_88 = *(double *)(this->node + iVar4);
      dStack_80 = this->node[iVar4].energy;
      pSVar1 = &this->node[iVar4].color;
      local_70 = (pSVar1->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
      dStack_68 = (pSVar1->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
      pdVar2 = this->node[iVar4].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
      local_60 = *pdVar2;
      dStack_58 = pdVar2[1];
      local_e8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 255.0;
      local_e8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 255.0;
      local_e8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 255.0;
      local_e8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      drawCrossNode(pWVar8,&this->img,(WSNNode *)&local_88,&local_e8);
      pWVar8 = (WSNTopologyBasedEnergy *)&local_88;
      WSNNode::~WSNNode((WSNNode *)&local_88);
    }
    local_128[0] = (WSNTopologyBasedEnergy *)local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"WSN","");
    local_f0 = 0;
    local_118._24_4_ = 0x1010000;
    local_f8 = this;
    cv::imshow((string *)local_128,(_InputArray *)(local_118 + 0x18));
    if (local_128[0] != (WSNTopologyBasedEnergy *)local_118) {
      operator_delete(local_128[0],local_118._0_8_ + 1);
    }
    if (this->Test == true) {
      cv::waitKey(0x46);
    }
    for (piVar9 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar9 != (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish; piVar9 = piVar9 + 1) {
      iVar4 = *piVar9;
      local_c8.leaderID = this->node[iVar4].leaderID;
      local_c8.id = this->node[iVar4].id;
      pWVar3 = this->node + iVar4;
      local_c8.x = pWVar3->x;
      local_c8.y = pWVar3->y;
      local_c8.energy = pWVar3->energy;
      pSVar1 = &this->node[iVar4].color;
      local_c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (pSVar1->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
      local_c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (pSVar1->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
      pdVar2 = this->node[iVar4].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
      local_c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar2;
      local_c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar2[1];
      pWVar8 = (WSNTopologyBasedEnergy *)&stack0xffffffffffffffb0;
      WSNNode::NodeColor((Scalar *)&stack0xffffffffffffffb0,this->node + *piVar9);
      drawCrossNode(pWVar8,&this->img,&local_c8,(Scalar *)&stack0xffffffffffffffb0);
      WSNNode::~WSNNode(&local_c8);
    }
    local_128[0] = (WSNTopologyBasedEnergy *)local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"WSN","");
    local_f0 = 0;
    local_118._24_4_ = 0x1010000;
    local_f8 = this;
    cv::imshow((string *)local_128,(_InputArray *)(local_118 + 0x18));
    pWVar8 = local_128[0];
    if (local_128[0] != (WSNTopologyBasedEnergy *)local_118) {
      operator_delete(local_128[0],local_118._0_8_ + 1);
    }
    if (this->Test == true) {
      pWVar8 = (WSNTopologyBasedEnergy *)0x46;
      cv::waitKey(0x46);
    }
    uVar6 = (int)local_118._16_8_ + 1;
    local_118._16_8_ = ZEXT48(uVar6);
  } while (uVar6 != 5);
  return __return_storage_ptr__;
}

Assistant:

vector<int> WSNTopologyBasedEnergy::SelectServalNode()
{
	vector<int> SelectNodeSeq;
	vector<int>::iterator it;

	srand((int)time(0));
	int SelectNodeNum=rand()%9+1;
	for(int i=0;i<SelectNodeNum;i++)
	{
		SelectNodeSeq.push_back(rand()%99);
	}

	//闪烁表示发送信号
	for(int i=0;i<LayerNum;i++)
	{
		for(it=SelectNodeSeq.begin();it!=SelectNodeSeq.end();it++)
		{
			drawCrossNode(img,node[*it],Scalar(255,255,255));
		}
		cv::imshow("WSN",img);
		if(true==Test) waitKey(70);
		for(it=SelectNodeSeq.begin();it!=SelectNodeSeq.end();it++)
		{
			drawCrossNode(img,node[*it],node[*it].NodeColor());	
		}
		cv::imshow("WSN",img);
		if(true==Test) waitKey(70);
	}
	return SelectNodeSeq;
}